

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day01b.cpp
# Opt level: O0

void day1b::run(void)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_28 [8];
  string input;
  
  read_file_abi_cxx11_((string *)local_28,"input/day1.txt");
  std::operator<<((ostream *)&std::cout,"day1b ");
  iVar1 = calculate_distance((string *)local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day1.txt");
		std::cout << "day1b ";
		std::cout << calculate_distance(input) << '\n';
		//std::cout << calculate_distance("R8, R4, R4, R8") << '\n';
	}